

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineOffsetCache.cpp
# Opt level: O3

void __thiscall
Js::LineOffsetCache::AddLine
          (LineOffsetCache *this,Recycler *allocator,charcount_t characterOffset,
          charcount_t byteOffset)

{
  Type *addr;
  Type *pTVar1;
  List<unsigned_int,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer> *list;
  ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *pRVar2;
  code *pcVar3;
  bool bVar4;
  Recycler *alloc;
  List<unsigned_int,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer> *this_00;
  undefined4 *puVar5;
  uint *puVar6;
  ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *pRVar7;
  undefined1 local_68 [8];
  TrackAllocData data;
  
  list = (List<unsigned_int,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer> *)
         (this->lineCharacterOffsetCacheList).ptr;
  this_00 = (List<unsigned_int,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer> *)
            (this->lineByteOffsetCacheList).ptr;
  addr = &this->lineByteOffsetCacheList;
  data._32_8_ = addr;
  if (this_00 ==
      (List<unsigned_int,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer> *)0x0 &&
      characterOffset != byteOffset) {
    local_68 = (undefined1  [8])
               &JsUtil::
                List<unsigned_int,Memory::Recycler,true,Js::CopyRemovePolicy,DefaultComparer>::
                typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_2c33433;
    data.filename._0_4_ = 0xdf;
    alloc = Memory::Recycler::TrackAllocInfo(allocator,(TrackAllocData *)local_68);
    this_00 = (List<unsigned_int,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer> *)
              new<Memory::Recycler>(0x30,alloc,0x387914);
    (this_00->super_ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>).alloc = allocator
    ;
    (this_00->super_ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>).
    _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014db338;
    (this_00->super_ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>).buffer.ptr =
         (uint *)0x0;
    (this_00->super_ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>).count = 0;
    this_00->length = 0;
    this_00->increment = 4;
    JsUtil::List<unsigned_int,Memory::Recycler,true,Js::CopyRemovePolicy,DefaultComparer>::
    Copy<JsUtil::List<unsigned_int,Memory::Recycler,true,Js::CopyRemovePolicy,DefaultComparer>>
              ((List<unsigned_int,Memory::Recycler,true,Js::CopyRemovePolicy,DefaultComparer> *)
               this_00,list);
    Memory::Recycler::WBSetBit((char *)addr);
    addr->ptr = (ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *)this_00;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
LAB_00781ad7:
    JsUtil::List<unsigned_int,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>::
    EnsureArray(this_00,0);
    (this_00->super_ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>).buffer.ptr
    [(this_00->super_ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>).count] =
         byteOffset;
    pTVar1 = &(this_00->super_ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>).count;
    *pTVar1 = *pTVar1 + 1;
  }
  else if (this_00 !=
           (List<unsigned_int,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer> *)0x0)
  goto LAB_00781ad7;
  JsUtil::List<unsigned_int,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>::
  EnsureArray(list,0);
  (list->super_ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>).buffer.ptr
  [(list->super_ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>).count] =
       characterOffset;
  pTVar1 = &(list->super_ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>).count;
  *pTVar1 = *pTVar1 + 1;
  pRVar7 = (this->lineCharacterOffsetCacheList).ptr;
  pRVar2 = (this->lineByteOffsetCacheList).ptr;
  if ((pRVar2 != (ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *)0x0) &&
     (pRVar2->count != pRVar7->count)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/LineOffsetCache.cpp"
                                ,0xea,
                                "(this->lineByteOffsetCacheList == nullptr || this->lineByteOffsetCacheList->Count() == this->lineCharacterOffsetCacheList->Count())"
                                ,
                                "this->lineByteOffsetCacheList == nullptr || this->lineByteOffsetCacheList->Count() == this->lineCharacterOffsetCacheList->Count()"
                               );
    if (!bVar4) goto LAB_00781c64;
    *puVar5 = 0;
    pRVar7 = (this->lineCharacterOffsetCacheList).ptr;
  }
  if (1 < pRVar7->count) {
    puVar6 = JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>::Item
                       (pRVar7,pRVar7->count + -2);
    if (characterOffset <= *puVar6) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/LineOffsetCache.cpp"
                                  ,0xef,"(characterOffset > previousCharacterOffset)",
                                  "The character offsets must be inserted in increasing order per line."
                                 );
      if (!bVar4) goto LAB_00781c64;
      *puVar5 = 0;
    }
    pRVar7 = *(ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> **)data._32_8_;
    if (pRVar7 != (ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *)0x0) {
      puVar6 = JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>::Item
                         (pRVar7,pRVar7->count + -2);
      if (byteOffset <= *puVar6) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/LineOffsetCache.cpp"
                                    ,0xf3,"(byteOffset > previousByteOffset)",
                                    "The byte offsets must be inserted in increasing order per line."
                                   );
        if (!bVar4) {
LAB_00781c64:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar5 = 0;
      }
    }
  }
  return;
}

Assistant:

void LineOffsetCache::AddLine(Recycler * allocator, charcount_t characterOffset, charcount_t byteOffset)
    {
        LineOffsetCacheList * characterOffsetList = (LineOffsetCacheList *)(LineOffsetCacheReadOnlyList*)this->lineCharacterOffsetCacheList;
        LineOffsetCacheList * byteOffsetList = (LineOffsetCacheList *)(LineOffsetCacheReadOnlyList*)this->lineByteOffsetCacheList;
        if (characterOffset != byteOffset && byteOffsetList == nullptr)
        {
                byteOffsetList = RecyclerNew(allocator, LineOffsetCacheList, allocator);
                byteOffsetList->Copy(characterOffsetList);
                this->lineByteOffsetCacheList = byteOffsetList;
        }
        if (byteOffsetList != nullptr)
        {
            byteOffsetList->Add(byteOffset);
        }
        characterOffsetList->Add(characterOffset);

#if DBG
        Assert(this->lineByteOffsetCacheList == nullptr || this->lineByteOffsetCacheList->Count() == this->lineCharacterOffsetCacheList->Count());
        if (this->lineCharacterOffsetCacheList->Count() > 1)
        {
            // Ensure that the list remains sorted during insertion.
            charcount_t previousCharacterOffset = this->lineCharacterOffsetCacheList->Item(this->lineCharacterOffsetCacheList->Count() - 2);
            AssertMsg(characterOffset > previousCharacterOffset, "The character offsets must be inserted in increasing order per line.");
            if (this->lineByteOffsetCacheList != nullptr)
            {
                charcount_t previousByteOffset = this->lineByteOffsetCacheList->Item(this->lineByteOffsetCacheList->Count() - 2);
                AssertMsg(byteOffset > previousByteOffset, "The byte offsets must be inserted in increasing order per line.");
            }
        }
#endif // DBG
    }